

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_service.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b9bb::Json2Array<aliyun::CdnDescribeCdnServiceLockReasonType>::Json2Array
          (Json2Array<aliyun::CdnDescribeCdnServiceLockReasonType> *this,Value *value,
          vector<aliyun::CdnDescribeCdnServiceLockReasonType,_std::allocator<aliyun::CdnDescribeCdnServiceLockReasonType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_48 [8];
  CdnDescribeCdnServiceLockReasonType val;
  int i;
  vector<aliyun::CdnDescribeCdnServiceLockReasonType,_std::allocator<aliyun::CdnDescribeCdnServiceLockReasonType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::CdnDescribeCdnServiceLockReasonType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.lock_reason.field_2._12_4_ = 0; uVar1 = val.lock_reason.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.lock_reason.field_2._12_4_ = val.lock_reason.field_2._12_4_ + 1) {
      aliyun::CdnDescribeCdnServiceLockReasonType::CdnDescribeCdnServiceLockReasonType
                ((CdnDescribeCdnServiceLockReasonType *)local_48);
      value_00 = Json::Value::operator[](value,val.lock_reason.field_2._12_4_);
      anon_unknown.dwarf_2b9bb::Json2Type(value_00,(CdnDescribeCdnServiceLockReasonType *)local_48);
      std::
      vector<aliyun::CdnDescribeCdnServiceLockReasonType,_std::allocator<aliyun::CdnDescribeCdnServiceLockReasonType>_>
      ::push_back(vec,(value_type *)local_48);
      aliyun::CdnDescribeCdnServiceLockReasonType::~CdnDescribeCdnServiceLockReasonType
                ((CdnDescribeCdnServiceLockReasonType *)local_48);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }